

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

LoopGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          ExpressionSyntax *args_6,Token *args_7,ExpressionSyntax *args_8,Token *args_9,
          ExpressionSyntax *args_10,Token *args_11,MemberSyntax *args_12)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TokenKind TVar21;
  undefined1 uVar22;
  NumericTokenFlags NVar23;
  uint32_t uVar24;
  TokenKind TVar25;
  undefined1 uVar26;
  NumericTokenFlags NVar27;
  uint32_t uVar28;
  TokenKind TVar29;
  undefined1 uVar30;
  NumericTokenFlags NVar31;
  uint32_t uVar32;
  TokenKind TVar33;
  undefined1 uVar34;
  NumericTokenFlags NVar35;
  uint32_t uVar36;
  TokenKind TVar37;
  undefined1 uVar38;
  NumericTokenFlags NVar39;
  uint32_t uVar40;
  LoopGenerateSyntax *this_00;
  
  this_00 = (LoopGenerateSyntax *)allocate(this,0xf0,8);
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar3 = args_3->info;
  TVar21 = args_4->kind;
  uVar22 = args_4->field_0x2;
  NVar23.raw = (args_4->numFlags).raw;
  uVar24 = args_4->rawLen;
  pIVar4 = args_4->info;
  TVar25 = args_5->kind;
  uVar26 = args_5->field_0x2;
  NVar27.raw = (args_5->numFlags).raw;
  uVar28 = args_5->rawLen;
  pIVar5 = args_5->info;
  TVar29 = args_7->kind;
  uVar30 = args_7->field_0x2;
  NVar31.raw = (args_7->numFlags).raw;
  uVar32 = args_7->rawLen;
  pIVar6 = args_7->info;
  TVar33 = args_9->kind;
  uVar34 = args_9->field_0x2;
  NVar35.raw = (args_9->numFlags).raw;
  uVar36 = args_9->rawLen;
  pIVar7 = args_9->info;
  TVar37 = args_11->kind;
  uVar38 = args_11->field_0x2;
  NVar39.raw = (args_11->numFlags).raw;
  uVar40 = args_11->rawLen;
  pIVar8 = args_11->info;
  syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,LoopGenerate,args);
  (this_00->keyword).kind = TVar9;
  (this_00->keyword).field_0x2 = uVar10;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (this_00->keyword).rawLen = uVar12;
  (this_00->keyword).info = pIVar1;
  (this_00->openParen).kind = TVar13;
  (this_00->openParen).field_0x2 = uVar14;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (this_00->openParen).rawLen = uVar16;
  (this_00->openParen).info = pIVar2;
  (this_00->genvar).kind = TVar17;
  (this_00->genvar).field_0x2 = uVar18;
  (this_00->genvar).numFlags = (NumericTokenFlags)NVar19.raw;
  (this_00->genvar).rawLen = uVar20;
  (this_00->genvar).info = pIVar3;
  (this_00->identifier).kind = TVar21;
  (this_00->identifier).field_0x2 = uVar22;
  (this_00->identifier).numFlags = (NumericTokenFlags)NVar23.raw;
  (this_00->identifier).rawLen = uVar24;
  (this_00->identifier).info = pIVar4;
  (this_00->equals).kind = TVar25;
  (this_00->equals).field_0x2 = uVar26;
  (this_00->equals).numFlags = (NumericTokenFlags)NVar27.raw;
  (this_00->equals).rawLen = uVar28;
  (this_00->equals).info = pIVar5;
  (this_00->initialExpr).ptr = args_6;
  (this_00->semi1).kind = TVar29;
  (this_00->semi1).field_0x2 = uVar30;
  (this_00->semi1).numFlags = (NumericTokenFlags)NVar31.raw;
  (this_00->semi1).rawLen = uVar32;
  (this_00->semi1).info = pIVar6;
  (this_00->stopExpr).ptr = args_8;
  (this_00->semi2).kind = TVar33;
  (this_00->semi2).field_0x2 = uVar34;
  (this_00->semi2).numFlags = (NumericTokenFlags)NVar35.raw;
  (this_00->semi2).rawLen = uVar36;
  (this_00->semi2).info = pIVar7;
  (this_00->iterationExpr).ptr = args_10;
  (this_00->closeParen).kind = TVar37;
  (this_00->closeParen).field_0x2 = uVar38;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar39.raw;
  (this_00->closeParen).rawLen = uVar40;
  (this_00->closeParen).info = pIVar8;
  (this_00->block).ptr = args_12;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_8->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_10->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_12->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }